

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFDie::getLowAndHighPC
          (DWARFDie *this,uint64_t *LowPC,uint64_t *HighPC,uint64_t *SectionIndex)

{
  bool *this_00;
  SectionedAddress *pSVar1;
  unsigned_long *puVar2;
  byte bVar3;
  Optional<unsigned_long> OVar4;
  undefined1 local_98 [8];
  Optional<llvm::DWARFFormValue> F;
  Optional<llvm::object::SectionedAddress> LowPcAddr;
  Optional<unsigned_long> HighPcAddr;
  
  find((Optional<llvm::DWARFFormValue> *)local_98,this,DW_AT_low_pc);
  this_00 = &F.Storage.hasVal;
  dwarf::toSectionedAddress
            ((Optional<llvm::object::SectionedAddress> *)this_00,
             (Optional<llvm::DWARFFormValue> *)local_98);
  if (LowPcAddr.Storage.field_0.value.SectionIndex._0_1_ == '\x01') {
    pSVar1 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                       ((OptionalStorage<llvm::object::SectionedAddress,_true> *)&F.Storage.hasVal);
    OVar4 = getHighPC(this,pSVar1->Address);
    LowPcAddr.Storage._16_8_ = OVar4.Storage.field_0;
    bVar3 = OVar4.Storage.hasVal;
    if (((undefined1  [16])OVar4.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pSVar1 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                         ((OptionalStorage<llvm::object::SectionedAddress,_true> *)this_00);
      *LowPC = pSVar1->Address;
      puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&LowPcAddr.Storage.hasVal);
      *HighPC = *puVar2;
      pSVar1 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                         ((OptionalStorage<llvm::object::SectionedAddress,_true> *)this_00);
      *SectionIndex = pSVar1->SectionIndex;
    }
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool DWARFDie::getLowAndHighPC(uint64_t &LowPC, uint64_t &HighPC,
                               uint64_t &SectionIndex) const {
  auto F = find(DW_AT_low_pc);
  auto LowPcAddr = toSectionedAddress(F);
  if (!LowPcAddr)
    return false;
  if (auto HighPcAddr = getHighPC(LowPcAddr->Address)) {
    LowPC = LowPcAddr->Address;
    HighPC = *HighPcAddr;
    SectionIndex = LowPcAddr->SectionIndex;
    return true;
  }
  return false;
}